

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

pseudo_t linearize_store_gen(dmr_C *C,entrypoint *ep,pseudo_t value,access_data *ad)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  symbol *psVar4;
  int iVar5;
  pseudo_t ppVar6;
  pseudo_t ppVar7;
  instruction *insn;
  symbol *psVar8;
  int iVar9;
  ulong val;
  access_data *ad_00;
  pseudo_t local_38;
  
  iVar9 = 0;
  if (ad->source_type != (symbol *)0x0) {
    iVar5 = (ad->source_type->field_14).field_1.normal;
    iVar9 = 0;
    if (0 < iVar5) {
      iVar9 = iVar5;
    }
  }
  psVar8 = ad->result_type;
  iVar5 = 0;
  if (psVar8 != (symbol *)0x0) {
    iVar3 = (psVar8->field_14).field_1.normal;
    iVar5 = 0;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
  }
  ppVar6 = value;
  if (iVar9 != iVar5) {
    bVar1 = *(byte *)((long)&psVar8->field_14 + 0xc);
    bVar2 = *(byte *)((long)&psVar8->field_14 + 8);
    ppVar6 = add_load(C,ep,ad);
    val = -1L << (bVar2 & 0x3f);
    local_38 = value;
    if ((ulong)bVar1 != 0) {
      psVar4 = ad->source_type;
      ppVar7 = dmrC_value_pseudo(C,psVar8,(ulong)bVar1);
      local_38 = add_binary_op(C,ep,psVar4,0x11,value,ppVar7);
      val = ~(~val << (bVar1 & 0x3f));
    }
    psVar4 = ad->source_type;
    ppVar7 = dmrC_value_pseudo(C,psVar8,val);
    ppVar6 = add_binary_op(C,ep,psVar4,0x14,ppVar6,ppVar7);
    ppVar6 = add_binary_op(C,ep,ad->source_type,0x15,ppVar6,local_38);
  }
  if (ep->active != (basic_block *)0x0) {
    ad_00 = (access_data *)0x2a;
    insn = alloc_typed_instruction(C,0x2a,ad->source_type);
    (insn->field_6).field_5.offset = ad->offset;
    psVar8 = get_base_symbol_type((dmr_C *)ad,ad_00);
    (insn->field_6).field_5.orig_type = psVar8;
    dmrC_use_pseudo(C,insn,ppVar6,&(insn->field_5).target);
    dmrC_use_pseudo(C,insn,ad->address,(pseudo_t *)&(insn->field_6).field_0);
    add_one_insn(C,ep,insn);
  }
  return value;
}

Assistant:

static pseudo_t linearize_store_gen(struct dmr_C *C, struct entrypoint *ep,
		pseudo_t value,
		struct access_data *ad)
{
	pseudo_t store = value;

	if (type_size(ad->source_type) != type_size(ad->result_type)) {
		struct symbol *ctype = ad->result_type;
		unsigned int shift = ctype->bit_offset;
		unsigned int size = ctype->bit_size;
		pseudo_t orig = add_load(C, ep, ad);
		unsigned long long mask = (1ULL << size) - 1;

		if (shift) {
			store = add_binary_op(C, ep, ad->source_type, OP_SHL, value, dmrC_value_pseudo(C, ctype, shift));
			mask <<= shift;
		}
		orig = add_binary_op(C, ep, ad->source_type, OP_AND, orig, dmrC_value_pseudo(C, ctype, ~mask));
		store = add_binary_op(C, ep, ad->source_type, OP_OR, orig, store);
	}
	add_store(C, ep, ad, store);
	return value;
}